

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::Psbt::GetGlobalXpubkeyBip32(KeyData *__return_storage_ptr__,Psbt *this,ExtPubkey *key)

{
  size_t sVar1;
  ulong uVar2;
  value_type_conflict2 *__x;
  uint8_t xpub_key;
  ByteData data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_arr;
  ByteData fingerprint;
  ByteData key_data;
  ByteData key_top;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  xpub_key = '\x01';
  ByteData::ByteData(&key_top,&xpub_key,1);
  ExtPubkey::GetData(&data,key);
  ByteData::Concat<cfd::core::ByteData>(&key_data,&key_top,&data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  GetGlobalRecord(&data,this,&key_data);
  ByteData::ByteData(&fingerprint);
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = ByteData::GetDataSize(&data);
  if ((sVar1 & 3) == 0) {
    sVar1 = ByteData::GetDataSize(&data);
    if (sVar1 != 0) {
      ByteData::GetBytes(&data_arr,&data);
      ByteData::ByteData((ByteData *)&local_48,
                         data_arr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,4);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint,&local_48);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
      __x = (value_type_conflict2 *)
            data_arr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      for (uVar2 = 1; __x = __x + 1,
          uVar2 < (ulong)((long)data_arr.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)data_arr.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2; uVar2 = uVar2 + 1) {
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&path,__x);
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data_arr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
  }
  KeyData::KeyData(__return_storage_ptr__,key,&path,&fingerprint);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_top);
  return __return_storage_ptr__;
}

Assistant:

KeyData Psbt::GetGlobalXpubkeyBip32(const ExtPubkey &key) const {
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetData());
  auto data = GetGlobalRecord(key_data);

  ByteData fingerprint;
  std::vector<uint32_t> path;
  if (((data.GetDataSize() % 4) == 0) && (data.GetDataSize() > 0)) {
    auto data_arr = data.GetBytes();
    fingerprint = ByteData(data_arr.data(), 4);

    // TODO(k-matsuzawa) Need endian support.
    size_t arr_max = data_arr.size() / 4;
    uint32_t *val_arr = reinterpret_cast<uint32_t *>(data_arr.data());
    for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
      path.push_back(val_arr[arr_index]);
    }
  }
  return KeyData(key, path, fingerprint);
}